

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_str.c
# Opt level: O1

adt_bytearray_t * adt_str_bytearray(adt_str_t *self)

{
  uint32_t u32NewLen;
  adt_error_t aVar1;
  uint32_t uVar2;
  adt_bytearray_t *self_00;
  uint8_t *__dest;
  
  if ((self != (adt_str_t *)0x0) &&
     (self_00 = adt_bytearray_new(0), self_00 != (adt_bytearray_t *)0x0)) {
    u32NewLen = self->s32Cur;
    aVar1 = adt_bytearray_resize(self_00,u32NewLen);
    if (aVar1 == '\0') {
      uVar2 = adt_bytearray_length(self_00);
      if (uVar2 == u32NewLen) {
        __dest = adt_bytearray_data(self_00);
        memcpy(__dest,self->pAlloc,(long)self->s32Cur);
        return self_00;
      }
      __assert_fail("adt_bytearray_length(retval) == u32Size",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/adt/src/adt_str.c"
                    ,0x25f,"adt_bytearray_t *adt_str_bytearray(adt_str_t *)");
    }
    adt_bytearray_delete(self_00);
  }
  return (adt_bytearray_t *)0x0;
}

Assistant:

adt_bytearray_t *adt_str_bytearray(adt_str_t *self)
{
   adt_bytearray_t *retval = (adt_bytearray_t*) 0;
   if (self != 0)
   {
      retval = adt_bytearray_new(ADT_BYTE_ARRAY_NO_GROWTH);
      if (retval != 0)
      {
         adt_error_t result;
         uint32_t u32Size = (uint32_t) self->s32Cur;
         result = adt_bytearray_resize(retval, u32Size);
         if (result == ADT_NO_ERROR)
         {
            assert(adt_bytearray_length(retval) == u32Size);
            memcpy(adt_bytearray_data(retval), self->pAlloc, (size_t) self->s32Cur);
         }
         else
         {
            adt_bytearray_delete(retval);
            retval = (adt_bytearray_t*) 0;
         }
      }
   }
   return retval;
}